

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
ParserProbModelXML::ParseArray(ParserProbModelXML *this,xmlNodePtr node)

{
  map<_xmlNode_*,_std::vector<double,_std::allocator<double>_>_*,_std::less<_xmlNode_*>,_std::allocator<std::pair<_xmlNode_*const,_std::vector<double,_std::allocator<double>_>_*>_>_>
  *this_00;
  size_type sVar1;
  vector<double,_std::allocator<double>_> *this_01;
  char *pcVar2;
  mapped_type *ppvVar3;
  xmlNodePtr node_local;
  double d;
  stringstream data;
  ostream local_198 [9];
  byte abStack_18f [7];
  byte abStack_188 [360];
  
  this_00 = &this->_m_arrayCache;
  node_local = node;
  sVar1 = std::
          map<_xmlNode_*,_std::vector<double,_std::allocator<double>_>_*,_std::less<_xmlNode_*>,_std::allocator<std::pair<_xmlNode_*const,_std::vector<double,_std::allocator<double>_>_*>_>_>
          ::count(this_00,&node_local);
  if (sVar1 == 0) {
    this_01 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
    (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::__cxx11::stringstream::stringstream((stringstream *)&data);
    pcVar2 = (char *)xmlNodeListGetString(this->_m_doc,node_local->children,1);
    std::operator<<(local_198,pcVar2);
    while ((abStack_188[*(long *)(_data + -0x18)] & 2) == 0) {
      abStack_18f[*(long *)(_data + -0x18)] = abStack_18f[*(long *)(_data + -0x18)] | 0x10;
      std::istream::_M_extract<double>((double *)&data);
      std::vector<double,_std::allocator<double>_>::push_back(this_01,&d);
    }
    ppvVar3 = std::
              map<_xmlNode_*,_std::vector<double,_std::allocator<double>_>_*,_std::less<_xmlNode_*>,_std::allocator<std::pair<_xmlNode_*const,_std::vector<double,_std::allocator<double>_>_*>_>_>
              ::operator[](this_00,&node_local);
    *ppvVar3 = this_01;
    std::__cxx11::stringstream::~stringstream((stringstream *)&data);
  }
  ppvVar3 = std::
            map<_xmlNode_*,_std::vector<double,_std::allocator<double>_>_*,_std::less<_xmlNode_*>,_std::allocator<std::pair<_xmlNode_*const,_std::vector<double,_std::allocator<double>_>_*>_>_>
            ::operator[](this_00,&node_local);
  return *ppvVar3;
}

Assistant:

const vector<double>* ParserProbModelXML::ParseArray(const xmlNodePtr node)
{
    if(_m_arrayCache.count(node) == 0)
    {
      //need to create new array
      vector<double>* p = new vector<double>();
      stringstream data;
      data << (char*) xmlNodeListGetString(GetDoc(), node->xmlChildrenNode, 1);

      double d;
      while(!data.eof())
      {
        data >> skipws >> d;
        p->push_back(d);
      }
      
      _m_arrayCache[node] = p;
    }

    return _m_arrayCache[node];
}